

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SR_binary.hh
# Opt level: O2

size_t OpenMesh::IO::
       binary<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
       ::restore(istream *param_1,value_type *param_2,bool param_3)

{
  ostream *poVar1;
  logic_error *this;
  ostringstream local_1b8 [8];
  ostringstream msg;
  string local_40 [32];
  
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  poVar1 = std::operator<<((ostream *)local_1b8,"Type not supported: ");
  std::operator<<(poVar1,
                  "N8OpenMesh13DefaultTraits7VertexTINS_15FinalMeshItemsTI8MyTraitsLb1EE7ITraitsENS4_4RefsEEE"
                 );
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::logic_error::logic_error(this,local_40);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static 
  size_t restore( std::istream& /* _is */,
		  value_type& /* _v */,
		  bool /* _swap=false */)
  { X; return 0; }